

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  byte bVar1;
  curl_ssl_ctx_callback p_Var2;
  proxy_info *ppVar3;
  ssl_config_data *psVar4;
  ssl_config_data *psVar5;
  Curl_easy *pCVar6;
  _Bool _Var7;
  ssl_connect_state sVar8;
  int iVar9;
  uint uVar10;
  curl_proxytype cVar11;
  CURLcode CVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  CURLcode CVar16;
  timediff_t tVar17;
  SSL_CIPHER *c;
  char *pcVar18;
  uint *puVar19;
  SSL_METHOD *meth;
  SSL_CTX *pSVar20;
  ulong uVar21;
  long lVar22;
  SSL_SESSION *ses;
  BIO_METHOD *pBVar23;
  BIO *pBVar24;
  stack_st_X509 *psVar25;
  Curl_easy *pCVar26;
  Curl_easy *pCVar27;
  X509_NAME *pXVar28;
  size_t sVar29;
  undefined8 uVar30;
  ASN1_INTEGER *pAVar31;
  ASN1_STRING *pAVar32;
  X509_EXTENSION *ex;
  BIO *pBVar33;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar34;
  EVP_PKEY *pEVar35;
  X509 *pXVar36;
  PKCS12 *p12;
  GENERAL_NAMES *a_00;
  int *piVar37;
  undefined8 extraout_RAX;
  undefined8 uVar38;
  X509_NAME_ENTRY *ne;
  ASN1_GENERALIZEDTIME *pAVar39;
  void *__src;
  SSL *pSVar40;
  evp_pkey_st *peVar41;
  rsa_st *r;
  UI_METHOD *method;
  UI_METHOD *pUVar42;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t uznum;
  X509 *pXVar43;
  OCSP_RESPONSE *resp;
  X509_PUBKEY *pXVar44;
  BIGNUM *pubkey;
  OCSP_BASICRESP *pOVar45;
  X509_STORE *pXVar46;
  OCSP_SINGLERESP *single;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  ssl_backend_data *psVar47;
  long lVar48;
  ssl_primary_config *psVar49;
  char **ppcVar50;
  undefined7 uVar51;
  curl_socket_t writefd;
  undefined7 in_register_00000011;
  long lVar52;
  X509_CINF *pXVar53;
  size_t size;
  char **ppcVar54;
  size_t size_00;
  long lVar55;
  char *pcVar56;
  Curl_easy *data;
  ssl_connect_data *psVar57;
  long lVar58;
  curl_socket_t readfd0;
  Curl_easy *pCVar59;
  ENGINE *e;
  Curl_easy *pCVar60;
  long lVar61;
  long lVar62;
  long lVar63;
  int iVar64;
  char cVar65;
  BIGNUM **buffer;
  long lVar66;
  ulong uVar67;
  X509_CINF *pXVar68;
  X509_CINF *pXVar69;
  bool bVar70;
  char *ptr;
  X509 *x509;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  in6_addr addr;
  EVP_PKEY *pri;
  char error_buffer [256];
  uchar protocols [128];
  ASN1_GENERALIZEDTIME *local_c78;
  OCSP_BASICRESP *local_c70;
  Curl_easy *local_c68;
  ssl_connect_data *local_c60;
  Curl_easy *local_c58;
  Curl_easy *local_c50;
  Curl_easy *local_c48;
  X509 *local_c40;
  char *local_c38;
  char *local_c30;
  SSL_CTX *local_c28;
  char *local_c20;
  char *local_c18;
  stack_st_X509 *local_c10;
  ASN1_GENERALIZEDTIME *local_c08;
  uint local_bfc;
  int *local_bf8;
  Curl_easy *local_bf0;
  _Bool *local_be8;
  uint local_bdc;
  X509 *local_bd8;
  long local_bd0;
  char *local_bc8;
  char *local_bc0;
  ASN1_GENERALIZEDTIME *local_bb8 [16];
  Curl_easy *local_b38;
  X509 *local_b30;
  BIGNUM *local_a38 [64];
  char local_838;
  undefined7 uStack_837;
  undefined1 uStack_830;
  undefined7 uStack_82f;
  connectdata *local_828;
  void *pvStack_820;
  undefined4 local_818;
  
  local_c70 = (OCSP_BASICRESP *)
              CONCAT44(local_c70._4_4_,(int)CONCAT71(in_register_00000011,nonblocking));
  lVar66 = (long)sockindex;
  if (conn->ssl[lVar66].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  pCVar26 = conn->data;
  psVar57 = conn->ssl + lVar66;
  local_c10 = (stack_st_X509 *)CONCAT44(local_c10._4_4_,conn->sock[lVar66]);
  sVar8 = conn->ssl[lVar66].connecting_state;
  local_c60 = psVar57;
  local_c50 = pCVar26;
  if (sVar8 == ssl_connect_1) {
    tVar17 = Curl_timeleft(pCVar26,(curltime *)0x0,true);
    if (tVar17 < 0) {
LAB_0043c433:
      Curl_failf(pCVar26,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    pCVar59 = conn->data;
    local_c30 = (char *)CONCAT44(local_c30._4_4_,sockindex);
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      local_c20 = (conn->http_proxy).host.name;
      lVar22 = 0xb68;
      lVar48 = 0x350;
      lVar58 = 0x358;
      lVar52 = 0x360;
      lVar63 = 0xb98;
      lVar61 = 0xb90;
      lVar62 = 0x340;
      lVar55 = 0xb60;
    }
    else {
      local_c20 = (conn->host).name;
      lVar22 = 0xab8;
      lVar48 = 0x300;
      lVar58 = 0x308;
      lVar52 = 0x310;
      lVar63 = 0xae8;
      lVar61 = 0xae0;
      lVar62 = 0x2f0;
      lVar55 = 0xab0;
    }
    local_bfc = conn->sock[lVar66];
    local_c18 = *(char **)((conn->chunk).hexbuffer + lVar58 + -0x20);
    local_c68 = *(Curl_easy **)((long)pCVar59->sockets + lVar63 + -0x80);
    uVar21 = *(ulong *)((conn->chunk).hexbuffer + lVar62 + -0x20);
    pCVar27 = *(Curl_easy **)((long)pCVar59->sockets + lVar61 + -0x80);
    local_c38 = *(char **)((conn->chunk).hexbuffer + lVar52 + -0x20);
    bVar1 = (conn->chunk).hexbuffer[lVar48 + -0x20];
    pXVar43 = *(X509 **)((long)pCVar59->sockets + lVar22 + -0x80);
    local_c48 = (Curl_easy *)(lVar66 * 3);
    local_be8 = done;
    CVar12 = Curl_ossl_seed(pCVar59);
    if (CVar12 != CURLE_OK) {
      return CVar12;
    }
    local_bdc = (uint)bVar1;
    *(undefined8 *)((long)pCVar59->sockets + lVar55 + -0x80) = 1;
    local_bd8 = pXVar43;
    local_bd0 = lVar66;
    if (7 < uVar21) {
      Curl_failf(pCVar59,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
      return CURLE_SSL_CONNECT_ERROR;
    }
    if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 == 2) {
        pcVar56 = "OpenSSL was built without SSLv2 support";
      }
      else {
        pcVar56 = "OpenSSL was built without SSLv3 support";
      }
      Curl_failf(pCVar59,pcVar56);
      return CURLE_NOT_BUILT_IN;
    }
    meth = (SSL_METHOD *)TLS_client_method();
    pSVar20 = (SSL_CTX *)(conn->ssl[lVar66].backend)->ctx;
    if (pSVar20 != (SSL_CTX *)0x0) {
      SSL_CTX_free(pSVar20);
    }
    pSVar20 = SSL_CTX_new(meth);
    pCVar6 = local_c48;
    (conn->ssl[lVar66].backend)->ctx = (SSL_CTX *)pSVar20;
    sockindex = (int)local_c30;
    if (pSVar20 == (SSL_CTX *)0x0) {
      uVar21 = ERR_peek_error();
      ERR_error_string_n(uVar21,(char *)local_a38,0x100);
      Curl_failf(pCVar59,"SSL: couldn\'t create a context: %s",local_a38);
      return CURLE_OUT_OF_MEMORY;
    }
    SSL_CTX_ctrl(pSVar20,0x21,0x10,(void *)0x0);
    if (((pCVar59->set).fdebug != (curl_debug_callback)0x0) && ((pCVar59->set).verbose == true)) {
      SSL_CTX_set_msg_callback((SSL_CTX *)(conn->ssl[lVar66].backend)->ctx,ssl_tls_trace);
      SSL_CTX_ctrl((SSL_CTX *)(conn->ssl[lVar66].backend)->ctx,0x10,0,conn);
    }
    pCVar26 = local_c50;
    uVar67 = 0x80024850;
    cVar11 = (conn->http_proxy).proxytype;
    if ((cVar11 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      cVar65 = (pCVar59->set).proxy_ssl.enable_beast;
    }
    else {
      cVar65 = (pCVar59->set).ssl.enable_beast;
    }
    if (cVar65 == '\0') {
      uVar67 = 0x80024050;
    }
    if ((0xf3UL >> (uVar21 & 0x3f) & 1) == 0) {
      if (uVar21 == 2) {
        uVar21 = uVar67 | 0x3e000000;
      }
      else {
        uVar21 = uVar67 | 0x3c000000;
      }
    }
    else {
      if (cVar11 == CURLPROXY_HTTPS) {
        bVar70 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        psVar49 = &conn->proxy_ssl_config;
        if (bVar70) {
          psVar49 = &conn->ssl_config;
        }
        lVar22 = 0x348;
        if (bVar70) {
          lVar22 = 0x2f8;
        }
      }
      else {
        psVar49 = &conn->ssl_config;
        lVar22 = 0x2f8;
      }
      uVar21 = uVar67 | 0x2000000;
      lVar48 = psVar49->version;
      lVar22 = *(long *)((conn->chunk).hexbuffer + lVar22 + -0x20);
      if (lVar48 == 5) {
LAB_0043c8a5:
        uVar21 = uVar21 | 0x4000000;
      }
      else {
        if (lVar48 == 6) {
LAB_0043c89e:
          uVar21 = uVar21 | 0x10000000;
          goto LAB_0043c8a5;
        }
        if (lVar48 == 7) {
          SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].backend)[(long)pCVar6]->ctx,0x7c,0x304,(void *)0x0)
          ;
          uVar21 = uVar67 | 0xa000000;
          goto LAB_0043c89e;
        }
      }
      if (lVar22 != 0x60000) {
        if (lVar22 != 0x50000) {
          if (lVar22 != 0x40000) goto LAB_0043d6be;
          uVar21 = uVar21 | 0x10000000;
        }
        uVar21 = uVar21 | 0x8000000;
      }
      uVar21 = uVar21 | 0x20000000;
    }
LAB_0043d6be:
    SSL_CTX_set_options((conn->ssl[lVar66].backend)->ctx,uVar21);
    if ((conn->bits).tls_enable_npn == true) {
      SSL_CTX_set_next_proto_select_cb
                ((SSL_CTX *)(conn->ssl[lVar66].backend)->ctx,select_next_proto_cb,conn);
    }
    if ((conn->bits).tls_enable_alpn == true) {
      local_838 = '\b';
      uStack_837 = 0x2e312f70747468;
      uStack_830 = 0x31;
      Curl_infof(pCVar59,"ALPN, offering %s\n","http/1.1");
      SSL_CTX_set_alpn_protos((conn->ssl[lVar66].backend)->ctx,&stack0xfffffffffffff7c8,9);
    }
    if (pCVar27 != (Curl_easy *)0x0 || local_c68 != (Curl_easy *)0x0) {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        psVar4 = &(pCVar59->set).ssl;
        psVar5 = &(pCVar59->set).ssl;
        bVar70 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
        if (!bVar70) {
          psVar5 = &(pCVar59->set).proxy_ssl;
          psVar4 = &(pCVar59->set).proxy_ssl;
        }
        ppcVar50 = &psVar4->key;
        ppcVar54 = &psVar5->key_type;
        lVar22 = 0xbb0;
        if (bVar70) {
          lVar22 = 0xb00;
        }
      }
      else {
        ppcVar50 = &(pCVar59->set).ssl.key;
        ppcVar54 = &(pCVar59->set).ssl.key_type;
        lVar22 = 0xb00;
      }
      local_c28 = (SSL_CTX *)(conn->ssl[lVar66].backend)->ctx;
      local_bf0 = (Curl_easy *)*ppcVar50;
      local_bc8 = *ppcVar54;
      pCVar60 = *(Curl_easy **)((long)pCVar59->sockets + lVar22 + -0x80);
      local_c58 = conn->data;
      iVar9 = do_file_type((char *)local_c68);
      pSVar20 = local_c28;
      psVar57 = local_c60;
      if (iVar9 == 0x2a || pCVar27 != (Curl_easy *)0x0) {
        if (pCVar60 != (Curl_easy *)0x0) {
          SSL_CTX_set_default_passwd_cb_userdata(local_c28,pCVar60);
          SSL_CTX_set_default_passwd_cb(pSVar20,passwd_callback);
        }
        data = local_c58;
        if (iVar9 < 0x2a) {
          if (iVar9 == 1) {
            local_c68 = pCVar60;
            iVar9 = SSL_CTX_use_certificate_chain_file(pSVar20,(char *)pCVar27);
            pCVar60 = local_c58;
            bVar70 = true;
            data = local_c58;
            if (iVar9 == 1) goto LAB_0043dc6c;
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,&stack0xfffffffffffff7c8,0x100);
            pcVar56 = 
            "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
          }
          else {
            if (iVar9 != 2) goto LAB_0043dc39;
            local_c68 = pCVar60;
            iVar9 = SSL_CTX_use_certificate_file(pSVar20,(char *)pCVar27,2);
            pCVar60 = local_c58;
            bVar70 = true;
            data = local_c58;
            if (iVar9 == 1) goto LAB_0043dc6c;
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,&stack0xfffffffffffff7c8,0x100);
            pcVar56 = 
            "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
            ;
          }
LAB_0043df04:
          pCVar27 = (Curl_easy *)&stack0xfffffffffffff7c8;
LAB_0043df07:
          Curl_failf(pCVar60,pcVar56,pCVar27);
          return CURLE_SSL_CERTPROBLEM;
        }
        if (iVar9 != 0x2a) {
          if (iVar9 == 0x2b) {
            local_c78 = (ASN1_GENERALIZEDTIME *)0x0;
            local_c68 = pCVar60;
            pBVar23 = BIO_s_file();
            pBVar24 = BIO_new(pBVar23);
            if (pBVar24 != (BIO *)0x0) {
              lVar66 = BIO_ctrl(pBVar24,0x6c,3,pCVar27);
              if ((int)lVar66 < 1) {
                Curl_failf(local_c58,"could not open PKCS12 file \'%s\'",pCVar27);
                BIO_free(pBVar24);
                return CURLE_SSL_CERTPROBLEM;
              }
              p12 = d2i_PKCS12_bio(pBVar24,(PKCS12 **)0x0);
              BIO_free(pBVar24);
              if (p12 == (PKCS12 *)0x0) {
                pcVar56 = "error reading PKCS12 file \'%s\'";
                pCVar60 = local_c58;
                goto LAB_0043df07;
              }
              PKCS12_PBE_add();
              iVar9 = PKCS12_parse(p12,(char *)local_c68,(EVP_PKEY **)&local_b38,&local_c40,
                                   (stack_st_X509 **)&local_c78);
              if (iVar9 == 0) {
                uVar21 = ERR_get_error();
                ERR_error_string_n(uVar21,&stack0xfffffffffffff7c8,0x100);
                Curl_failf(local_c58,"could not parse PKCS12 file, check password, OpenSSL error %s"
                           ,&stack0xfffffffffffff7c8);
                PKCS12_free(p12);
                return CURLE_SSL_CERTPROBLEM;
              }
              PKCS12_free(p12);
              iVar9 = SSL_CTX_use_certificate(pSVar20,local_c40);
              if (iVar9 == 1) {
                iVar9 = SSL_CTX_use_PrivateKey(pSVar20,(EVP_PKEY *)local_b38);
                if (iVar9 == 1) {
                  iVar9 = SSL_CTX_check_private_key(local_c28);
                  pSVar20 = local_c28;
                  if (iVar9 != 0) {
                    if (local_c78 != (ASN1_GENERALIZEDTIME *)0x0) {
                      do {
                        iVar9 = OPENSSL_sk_num(local_c78);
                        if (iVar9 == 0) goto LAB_0043f31a;
                        pXVar43 = (X509 *)OPENSSL_sk_pop(local_c78);
                        iVar9 = SSL_CTX_add_client_CA(pSVar20,pXVar43);
                        if (iVar9 == 0) {
                          X509_free(pXVar43);
                          pcVar56 = "cannot add certificate to client CA list";
                          goto LAB_0043f362;
                        }
                        lVar66 = SSL_CTX_ctrl(pSVar20,0xe,0,pXVar43);
                      } while (lVar66 != 0);
                      X509_free(pXVar43);
                      pcVar56 = "cannot add certificate to certificate chain";
LAB_0043f362:
                      Curl_failf(local_c58,pcVar56);
                      goto LAB_0043f2ed;
                    }
LAB_0043f31a:
                    EVP_PKEY_free((EVP_PKEY *)local_b38);
                    X509_free(local_c40);
                    OPENSSL_sk_pop_free(local_c78,X509_free);
                    bVar70 = false;
                    data = local_c58;
                    pCVar26 = local_c50;
                    goto LAB_0043dc6c;
                  }
                  pcVar56 = 
                  "private key from PKCS12 file \'%s\' does not match certificate in same file";
                }
                else {
                  pcVar56 = "unable to use private key from PKCS12 file \'%s\'";
                }
              }
              else {
                uVar21 = ERR_get_error();
                pCVar27 = (Curl_easy *)&stack0xfffffffffffff7c8;
                ERR_error_string_n(uVar21,(char *)pCVar27,0x100);
                pcVar56 = "could not load PKCS12 client certificate, OpenSSL error %s";
              }
              Curl_failf(local_c58,pcVar56,pCVar27);
LAB_0043f2ed:
              EVP_PKEY_free((EVP_PKEY *)local_b38);
              X509_free(local_c40);
              OPENSSL_sk_pop_free(local_c78,X509_free);
              return CURLE_SSL_CERTPROBLEM;
            }
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,&stack0xfffffffffffff7c8,0x100);
            pcVar56 = "BIO_new return NULL, OpenSSL error %s";
            pCVar60 = local_c58;
            goto LAB_0043df04;
          }
LAB_0043dc39:
          pcVar56 = "not supported file type \'%s\' for certificate";
          pCVar27 = local_c68;
          pCVar60 = local_c58;
          goto LAB_0043df07;
        }
        e = (ENGINE *)(local_c58->state).engine;
        local_c68 = pCVar60;
        if (e == (ENGINE *)0x0) {
          if (pCVar27 != (Curl_easy *)0x0) {
            iVar9 = Curl_strncasecompare((char *)pCVar27,"pkcs11:",7);
            if ((iVar9 != 0) && (CVar12 = Curl_ossl_set_engine(data,"pkcs11"), CVar12 != CURLE_OK))
            {
              return CURLE_SSL_CERTPROBLEM;
            }
            e = (ENGINE *)(data->state).engine;
            if (e != (ENGINE *)0x0) goto LAB_0043dcbb;
          }
          pcVar56 = "crypto engine not set, can\'t load certificate";
          goto LAB_0043f203;
        }
LAB_0043dcbb:
        local_b30 = (X509 *)0x0;
        local_b38 = pCVar27;
        iVar9 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
        if (iVar9 == 0) {
          pcVar56 = "ssl engine does not support loading certificates";
          goto LAB_0043f203;
        }
        iVar9 = ENGINE_ctrl_cmd((ENGINE *)(data->state).engine,"LOAD_CERT_CTRL",0,&local_b38,
                                (f *)0x0,1);
        if (iVar9 == 0) {
          uVar21 = ERR_get_error();
          pcVar56 = &stack0xfffffffffffff7c8;
          ERR_error_string_n(uVar21,pcVar56,0x100);
          pcVar18 = "ssl engine cannot load client cert with id \'%s\' [%s]";
          goto LAB_0043e1cb;
        }
        if (local_b30 == (X509 *)0x0) {
          pcVar56 = "ssl engine didn\'t initialized the certificate properly.";
          goto LAB_0043f203;
        }
        iVar9 = SSL_CTX_use_certificate(pSVar20,local_b30);
        if (iVar9 != 1) {
          Curl_failf(data,"unable to set client certificate");
          X509_free(local_b30);
          return CURLE_SSL_CERTPROBLEM;
        }
        X509_free(local_b30);
        bVar70 = true;
LAB_0043dc6c:
        iVar9 = do_file_type(local_bc8);
        pSVar20 = local_c28;
        if (iVar9 < 0x2a) {
          pCVar60 = local_bf0;
          if (iVar9 == 1) {
            if (!bVar70) goto LAB_0043e002;
            if (local_bf0 == (Curl_easy *)0x0) {
              pCVar60 = pCVar27;
            }
          }
          else if (iVar9 != 2) {
LAB_0043dfc1:
            pcVar56 = "not supported file type for private key";
            goto LAB_0043f203;
          }
          pCVar27 = pCVar60;
          iVar9 = SSL_CTX_use_PrivateKey_file(local_c28,(char *)pCVar27,iVar9);
          if (iVar9 != 1) {
            pcVar56 = "PEM";
            if (local_bc8 != (char *)0x0) {
              pcVar56 = local_bc8;
            }
            pcVar18 = "unable to set private key file: \'%s\' type %s";
LAB_0043e1cb:
            Curl_failf(data,pcVar18,pCVar27,pcVar56);
            return CURLE_SSL_CERTPROBLEM;
          }
        }
        else if (iVar9 == 0x2a) {
          if ((data->state).engine == (void *)0x0) {
            if (local_bf0 != (Curl_easy *)0x0) {
              iVar9 = Curl_strncasecompare((char *)local_bf0,"pkcs11:",7);
              if ((iVar9 != 0) && (CVar12 = Curl_ossl_set_engine(data,"pkcs11"), CVar12 != CURLE_OK)
                 ) {
                return CURLE_SSL_CERTPROBLEM;
              }
              if ((data->state).engine != (void *)0x0) goto LAB_0043e0af;
            }
            pcVar56 = "crypto engine not set, can\'t load private key";
            goto LAB_0043f203;
          }
LAB_0043e0af:
          method = UI_create_method("curl user interface");
          if (method == (UI_METHOD *)0x0) {
            pcVar56 = "unable do create OpenSSL user-interface method";
            goto LAB_0043f203;
          }
          pUVar42 = UI_OpenSSL();
          iVar9 = UI_method_get_opener((UI *)pUVar42);
          UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar9));
          pUVar42 = UI_OpenSSL();
          iVar9 = UI_method_get_closer((UI *)pUVar42);
          UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar9));
          UI_method_set_reader(method,ssl_ui_reader);
          UI_method_set_writer(method,ssl_ui_writer);
          pEVar35 = ENGINE_load_private_key
                              ((ENGINE *)(data->state).engine,(char *)local_bf0,method,local_c68);
          UI_destroy_method(method);
          if (pEVar35 == (EVP_PKEY *)0x0) {
            pcVar56 = "failed to load private key from crypto engine";
            data = local_c58;
            goto LAB_0043f203;
          }
          iVar9 = SSL_CTX_use_PrivateKey(local_c28,pEVar35);
          if (iVar9 != 1) {
            Curl_failf(local_c58,"unable to set private key");
            EVP_PKEY_free(pEVar35);
            return CURLE_SSL_CERTPROBLEM;
          }
          EVP_PKEY_free(pEVar35);
          pSVar20 = local_c28;
          data = local_c58;
          pCVar26 = local_c50;
        }
        else {
          if (iVar9 != 0x2b) goto LAB_0043dfc1;
          if (bVar70) {
            pcVar56 = "file type P12 for private key not supported";
            goto LAB_0043f203;
          }
        }
LAB_0043e002:
        pSVar40 = SSL_new(pSVar20);
        if (pSVar40 == (SSL *)0x0) {
          pcVar56 = "unable to create an SSL structure";
          goto LAB_0043f203;
        }
        local_c40 = SSL_get_certificate(pSVar40);
        if (local_c40 != (X509 *)0x0) {
          pEVar35 = X509_get_pubkey(local_c40);
          peVar41 = SSL_get_privatekey(pSVar40);
          EVP_PKEY_copy_parameters(pEVar35,peVar41);
          EVP_PKEY_free(pEVar35);
        }
        peVar41 = SSL_get_privatekey(pSVar40);
        iVar9 = EVP_PKEY_get_id(peVar41);
        if (iVar9 == 6) {
          r = EVP_PKEY_get1_RSA(peVar41);
          uVar10 = RSA_flags(r);
          RSA_free(r);
          SSL_free(pSVar40);
          psVar57 = local_c60;
          if ((uVar10 & 1) != 0) goto LAB_0043eab5;
        }
        else {
          SSL_free(pSVar40);
        }
        iVar9 = SSL_CTX_check_private_key(pSVar20);
        psVar57 = local_c60;
        if (iVar9 == 0) {
          pcVar56 = "Private key does not match the certificate public key";
          data = local_c58;
LAB_0043f203:
          Curl_failf(data,pcVar56);
          return CURLE_SSL_CERTPROBLEM;
        }
      }
    }
LAB_0043eab5:
    cVar11 = (conn->http_proxy).proxytype;
    if ((cVar11 != CURLPROXY_HTTPS) ||
       (lVar66 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar66 = 0x330;
    }
    pcVar56 = *(char **)((conn->chunk).hexbuffer + lVar66 + -0x20);
    if (pcVar56 != (char *)0x0) {
      iVar9 = SSL_CTX_set_cipher_list((SSL_CTX *)psVar57->backend->ctx,pcVar56);
      if (iVar9 == 0) {
        pcVar18 = "failed setting cipher list: %s";
        goto LAB_0043ec37;
      }
      Curl_infof(pCVar59,"Cipher selection: %s\n",pcVar56);
      cVar11 = (conn->http_proxy).proxytype;
    }
    if ((cVar11 != CURLPROXY_HTTPS) ||
       (lVar66 = 0x388, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar66 = 0x338;
    }
    pcVar56 = *(char **)((conn->chunk).hexbuffer + lVar66 + -0x20);
    if (pcVar56 != (char *)0x0) {
      iVar9 = SSL_CTX_set_ciphersuites(psVar57->backend->ctx,pcVar56);
      if (iVar9 == 0) {
        pcVar18 = "failed setting TLS 1.3 cipher suite: %s";
LAB_0043ec37:
        Curl_failf(pCVar59,pcVar18,pcVar56);
        return CURLE_SSL_CIPHER;
      }
      Curl_infof(pCVar59,"TLS 1.3 cipher selection: %s\n",pcVar56);
    }
    SSL_CTX_set_post_handshake_auth(psVar57->backend->ctx,1);
    pXVar43 = local_bd8;
    if (local_c38 != (char *)0x0 || local_c18 != (char *)0x0) {
      iVar9 = SSL_CTX_load_verify_locations((SSL_CTX *)psVar57->backend->ctx,local_c38,local_c18);
      if ((local_bdc != 0) && (iVar9 == 0)) {
        pcVar56 = local_c38;
        if (local_c38 == (char *)0x0) {
          pcVar56 = "none";
        }
        pcVar18 = "none";
        if (local_c18 != (char *)0x0) {
          pcVar18 = local_c18;
        }
        Curl_failf(pCVar59,"error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s"
                   ,pcVar56,pcVar18);
        return CURLE_SSL_CACERT_BADFILE;
      }
      pcVar56 = "error setting certificate verify locations, continuing anyway:\n";
      if (iVar9 != 0) {
        pcVar56 = "successfully set certificate verify locations:\n";
      }
      Curl_infof(pCVar59,pcVar56);
      pcVar56 = local_c38;
      if (local_c38 == (char *)0x0) {
        pcVar56 = "none";
      }
      pcVar18 = "none";
      if (local_c18 != (char *)0x0) {
        pcVar18 = local_c18;
      }
      Curl_infof(pCVar59,"  CAfile: %s\n  CApath: %s\n",pcVar56,pcVar18);
    }
    if (pXVar43 != (X509 *)0x0) {
      pXVar46 = SSL_CTX_get_cert_store((SSL_CTX *)psVar57->backend->ctx);
      m = X509_LOOKUP_file();
      pXVar43 = local_bd8;
      ctx = X509_STORE_add_lookup(pXVar46,m);
      if ((ctx == (X509_LOOKUP *)0x0) ||
         (iVar9 = X509_load_crl_file(ctx,(char *)pXVar43,1), iVar9 == 0)) {
        Curl_failf(pCVar59,"error loading CRL file: %s",pXVar43);
        return CURLE_SSL_CRL_BADFILE;
      }
      Curl_infof(pCVar59,"successfully load CRL file:\n");
      pXVar46 = SSL_CTX_get_cert_store((SSL_CTX *)psVar57->backend->ctx);
      X509_STORE_set_flags(pXVar46,0xc);
      Curl_infof(pCVar59,"  CRLfile: %s\n",pXVar43);
    }
    SSL_CTX_set_verify((SSL_CTX *)psVar57->backend->ctx,local_bdc,(callback *)0x0);
    if (keylog_file_fp != (FILE *)0x0) {
      SSL_CTX_set_keylog_callback(psVar57->backend->ctx,ossl_keylog_callback);
    }
    p_Var2 = (pCVar59->set).ssl.fsslctx;
    if ((p_Var2 != (curl_ssl_ctx_callback)0x0) &&
       (CVar12 = (*p_Var2)(pCVar59,psVar57->backend->ctx,(pCVar59->set).ssl.fsslctxp),
       CVar12 != CURLE_OK)) {
      pcVar56 = "error signaled by ssl ctx callback";
      goto LAB_0043c99f;
    }
    psVar47 = psVar57->backend;
    if ((SSL *)psVar47->handle != (SSL *)0x0) {
      SSL_free((SSL *)psVar47->handle);
      psVar47 = psVar57->backend;
    }
    pSVar40 = SSL_new((SSL_CTX *)psVar47->ctx);
    pcVar56 = local_c20;
    psVar57->backend->handle = (SSL *)pSVar40;
    if (pSVar40 == (SSL *)0x0) {
      Curl_failf(pCVar59,"SSL: couldn\'t create a context (handle)!");
      return CURLE_OUT_OF_MEMORY;
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_0043ee3f:
        SSL_ctrl(pSVar40,0x41,1,(void *)0x0);
        pSVar40 = (SSL *)psVar57->backend->handle;
      }
    }
    else if ((conn->ssl_config).verifystatus == true) goto LAB_0043ee3f;
    SSL_set_connect_state(pSVar40);
    psVar57->backend->server_cert = (X509 *)0x0;
    iVar9 = inet_pton(2,pcVar56,local_bb8);
    if (((iVar9 == 0) && (iVar9 = inet_pton(10,pcVar56,local_bb8), iVar9 == 0)) &&
       (lVar66 = SSL_ctrl((SSL *)psVar57->backend->handle,0x37,0,pcVar56), lVar66 == 0)) {
      Curl_infof(pCVar59,"WARNING: failed to configure server name indication (SNI) TLS extension\n"
                );
    }
    if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      if ((pCVar59->set).proxy_ssl.primary.sessionid != false) {
LAB_0043ef43:
        local_838 = '\0';
        uStack_837 = 0;
        Curl_ssl_sessionid_lock(conn);
        _Var7 = Curl_ssl_getsessionid
                          (conn,(void **)&stack0xfffffffffffff7c8,(size_t *)0x0,sockindex);
        if (!_Var7) {
          iVar9 = SSL_set_session((SSL *)psVar57->backend->handle,
                                  (SSL_SESSION *)CONCAT71(uStack_837,local_838));
          if (iVar9 == 0) {
            Curl_ssl_sessionid_unlock(conn);
            uVar21 = ERR_get_error();
            ERR_error_string_n(uVar21,(char *)local_a38,0x100);
            pcVar56 = "SSL: SSL_set_session failed: %s";
            goto LAB_0043f09f;
          }
          Curl_infof(pCVar59,"SSL re-using session ID\n");
        }
        Curl_ssl_sessionid_unlock(conn);
      }
    }
    else if ((pCVar59->set).ssl.primary.sessionid == true) goto LAB_0043ef43;
    if ((&conn->proxy_ssl[0].use)[(long)pCVar6 * 8] == true) {
      pBVar23 = BIO_f_ssl();
      pBVar24 = BIO_new(pBVar23);
      BIO_ctrl(pBVar24,0x6d,0,(&conn->proxy_ssl[0].backend)[(long)pCVar6]->handle);
      SSL_set_bio((SSL *)psVar57->backend->handle,pBVar24,pBVar24);
    }
    else {
      iVar9 = SSL_set_fd((SSL *)psVar57->backend->handle,local_bfc);
      if (iVar9 == 0) {
        uVar21 = ERR_get_error();
        ERR_error_string_n(uVar21,(char *)local_a38,0x100);
        pcVar56 = "SSL: SSL_set_fd failed: %s";
LAB_0043f09f:
        Curl_failf(pCVar59,pcVar56,local_a38);
        return CURLE_SSL_CONNECT_ERROR;
      }
    }
    psVar57->connecting_state = ssl_connect_2;
    sVar8 = ssl_connect_2;
    done = local_be8;
    lVar66 = local_bd0;
  }
  local_c30 = (char *)CONCAT44(local_c30._4_4_,sockindex);
  local_be8 = done;
  local_bd0 = lVar66;
  while (sVar8 - ssl_connect_2 < 3) {
    tVar17 = Curl_timeleft(pCVar26,(curltime *)0x0,true);
    if (tVar17 < 0) goto LAB_0043c433;
    sVar8 = psVar57->connecting_state;
    if ((sVar8 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar8 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_c10;
      }
      readfd0 = -1;
      if (sVar8 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_c10;
      }
      if ((char)local_c70 != '\0') {
        tVar17 = 0;
      }
      iVar9 = Curl_socket_check(readfd0,-1,writefd,tVar17);
      if (iVar9 < 0) {
        puVar19 = (uint *)__errno_location();
        Curl_failf(pCVar26,"select/poll on SSL socket, errno: %d",(ulong)*puVar19);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if (iVar9 == 0) {
        if ((char)local_c70 != '\0') {
          *local_be8 = false;
          return CURLE_OK;
        }
        goto LAB_0043c433;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar66 = 0xb60, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar66 = 0xab0;
    }
    pCVar59 = conn->data;
    ERR_clear_error();
    iVar9 = SSL_connect((SSL *)psVar57->backend->handle);
    if (iVar9 == 1) {
      psVar57->connecting_state = ssl_connect_3;
      pSVar40 = (SSL *)psVar57->backend->handle;
      pcVar56 = "";
      if (pSVar40 != (SSL *)0x0) {
        iVar9 = SSL_version(pSVar40);
        pcVar56 = "TLSv1.3";
        switch(iVar9) {
        case 0x300:
          pcVar56 = "SSLv3";
          break;
        case 0x301:
          pcVar56 = "TLSv1.0";
          break;
        case 0x302:
          pcVar56 = "TLSv1.1";
          break;
        case 0x303:
          pcVar56 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar9 == 2) {
            pcVar56 = "SSLv2";
          }
          else {
            pcVar56 = "unknown";
          }
        }
      }
      psVar57 = local_c60;
      c = SSL_get_current_cipher((SSL *)local_c60->backend->handle);
      pcVar18 = SSL_CIPHER_get_name(c);
      Curl_infof(pCVar59,"SSL connection using %s / %s\n",pcVar56,pcVar18);
      pCVar26 = local_c50;
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(psVar57->backend->handle,&stack0xfffffffffffff7c8,local_a38);
        if ((int)local_a38[0] == 0) {
          Curl_infof(pCVar59,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar59,"ALPN, server accepted to use %.*s\n",(ulong)local_a38[0] & 0xffffffff,
                     CONCAT71(uStack_837,local_838));
          if (((int)local_a38[0] == 8) &&
             (*(long *)CONCAT71(uStack_837,local_838) == 0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar10 = SSL_get_error((SSL *)psVar57->backend->handle,iVar9);
      pCVar26 = local_c50;
      if (uVar10 == 3) {
        psVar57->connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar10 != 2) {
          memset(&stack0xfffffffffffff7c8,0,0x100);
          local_c60->connecting_state = ssl_connect_2;
          uVar21 = ERR_get_error();
          uVar15 = (uint)uVar21;
          if (((-1 < (int)uVar15) && ((uVar15 & 0xff800000) == 0xa000000)) &&
             ((uVar15 & 0x7fffff) == 0x86)) {
            lVar22 = SSL_get_verify_result((SSL *)local_c60->backend->handle);
            if (lVar22 == 0) {
              local_828 = (connectdata *)0x6163696669726576;
              pvStack_820 = (void *)0x696166206e6f6974;
              local_838 = 'S';
              uStack_837 = 0x74726563204c53;
              uStack_830 = 0x69;
              uStack_82f = 0x20657461636966;
              local_818 = 0x64656c;
            }
            else {
              *(long *)((long)pCVar59->sockets + lVar66 + -0x80) = lVar22;
              pcVar56 = X509_verify_cert_error_string(lVar22);
              curl_msnprintf(&stack0xfffffffffffff7c8,0x100,"SSL certificate problem: %s",pcVar56);
            }
            CVar12 = CURLE_PEER_FAILED_VERIFICATION;
LAB_0043ca34:
            Curl_failf(pCVar59,"%s",&stack0xfffffffffffff7c8);
            return CVar12;
          }
          ERR_error_string_n(uVar21,&stack0xfffffffffffff7c8,0x100);
          CVar12 = CURLE_SSL_CONNECT_ERROR;
          if (uVar21 != 0) goto LAB_0043ca34;
          if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
            bVar70 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
            ppVar3 = &conn->http_proxy;
            if (bVar70) {
              ppVar3 = (proxy_info *)&conn->host;
            }
            pcVar56 = (ppVar3->host).name;
            if (!bVar70) {
              lVar66 = conn->port;
              goto LAB_0043dbe8;
            }
          }
          else {
            pcVar56 = (conn->host).name;
          }
          lVar66 = (long)conn->remote_port;
LAB_0043dbe8:
          if (uVar10 < 0xb) {
            pcVar18 = (&PTR_anon_var_dwarf_1647b01_005c3698)[uVar10];
          }
          else {
            pcVar18 = "SSL_ERROR unknown";
          }
          Curl_failf(pCVar59,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar18,pcVar56,
                     lVar66);
          return CURLE_SSL_CONNECT_ERROR;
        }
        local_c60->connecting_state = ssl_connect_2_reading;
        psVar57 = local_c60;
      }
    }
    sVar8 = psVar57->connecting_state;
    if (((char)local_c70 != '\0') && (sVar8 - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar8 == ssl_connect_3) {
    pCVar59 = conn->data;
    cVar11 = (conn->http_proxy).proxytype;
    if ((cVar11 == CURLPROXY_HTTPS) &&
       (iVar9 = conn->sock[1], conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete)) {
      if ((pCVar59->set).proxy_ssl.primary.sessionid != false) {
LAB_0043c8f3:
        local_838 = '\0';
        uStack_837 = 0;
        ses = SSL_get1_session((SSL *)psVar57->backend->handle);
        Curl_ssl_sessionid_lock(conn);
        _Var7 = Curl_ssl_getsessionid
                          (conn,(void **)&stack0xfffffffffffff7c8,(size_t *)0x0,(int)local_c30);
        if ((_Var7) || ((SSL_SESSION *)CONCAT71(uStack_837,local_838) == ses)) {
          if (_Var7) goto LAB_0043c96c;
          SSL_SESSION_free(ses);
        }
        else {
          Curl_infof(pCVar59,"old SSL session ID is stale, removing\n");
          Curl_ssl_delsessionid(conn,(void *)CONCAT71(uStack_837,local_838));
LAB_0043c96c:
          CVar12 = Curl_ssl_addsessionid(conn,ses,0,(int)local_c30);
          if (CVar12 != CURLE_OK) {
            Curl_ssl_sessionid_unlock(conn);
            pcVar56 = "failed to store ssl session";
LAB_0043c99f:
            Curl_failf(pCVar59,pcVar56);
            return CVar12;
          }
        }
        Curl_ssl_sessionid_unlock(conn);
        cVar11 = (conn->http_proxy).proxytype;
        goto LAB_0043ca6d;
      }
LAB_0043ca7d:
      if (conn->proxy_ssl[iVar9 != -1].state == ssl_connection_complete) goto LAB_0043ca95;
      if ((conn->proxy_ssl_config).verifypeer == true) {
        pCVar26 = conn->data;
        memset(&local_b38,0,0x100);
        local_c38 = (char *)0xb60;
        goto LAB_0043cb10;
      }
      cVar65 = (conn->proxy_ssl_config).verifyhost;
      pCVar26 = conn->data;
      memset(&local_b38,0,0x100);
      local_c38 = (char *)0xb60;
    }
    else {
      if ((pCVar59->set).ssl.primary.sessionid == true) goto LAB_0043c8f3;
LAB_0043ca6d:
      if (cVar11 == CURLPROXY_HTTPS) {
        iVar9 = conn->sock[1];
        goto LAB_0043ca7d;
      }
LAB_0043ca95:
      if ((conn->ssl_config).verifypeer == true) {
        pCVar26 = conn->data;
        memset(&local_b38,0,0x100);
        local_c38 = (char *)0xab0;
LAB_0043cb10:
        cVar65 = '\x01';
      }
      else {
        cVar65 = (conn->ssl_config).verifyhost;
        pCVar26 = conn->data;
        memset(&local_b38,0,0x100);
        local_c38 = (char *)0xab0;
      }
    }
    pBVar23 = BIO_s_mem();
    pBVar24 = BIO_new(pBVar23);
    if ((pCVar26->set).ssl.certinfo == true) {
      pCVar59 = conn->data;
      psVar25 = SSL_get_peer_cert_chain((SSL *)psVar57->backend->handle);
      if (psVar25 != (stack_st_X509 *)0x0) {
        iVar9 = OPENSSL_sk_num(psVar25);
        CVar12 = Curl_ssl_init_certinfo(pCVar59,iVar9);
        if (CVar12 == CURLE_OK) {
          local_c18 = (char *)CONCAT71(local_c18._1_7_,cVar65);
          local_c68 = pCVar26;
          local_c10 = psVar25;
          pBVar23 = BIO_s_mem();
          pCVar26 = (Curl_easy *)BIO_new(pBVar23);
          if (0 < iVar9) {
            iVar13 = 0;
            local_c30 = (char *)CONCAT44(local_c30._4_4_,iVar9);
            local_c48 = pCVar26;
            do {
              pCVar27 = (Curl_easy *)OPENSSL_sk_value(local_c10,iVar13);
              local_bf8 = (int *)0x0;
              pXVar28 = X509_get_subject_name((X509 *)pCVar27);
              X509_NAME_print_ex((BIO *)pCVar26,pXVar28,0,0x82031f);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              Curl_ssl_push_certinfo_len(pCVar59,iVar13,"Subject",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              pXVar28 = X509_get_issuer_name((X509 *)pCVar27);
              X509_NAME_print_ex((BIO *)pCVar26,pXVar28,0,0x82031f);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              Curl_ssl_push_certinfo_len(pCVar59,iVar13,"Issuer",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              uVar30 = X509_get_version(pCVar27);
              BIO_printf((BIO *)pCVar26,"%lx",uVar30);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              local_c70 = (OCSP_BASICRESP *)CONCAT44(local_c70._4_4_,iVar13);
              Curl_ssl_push_certinfo_len(pCVar59,iVar13,"Version",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              local_c50 = pCVar27;
              pAVar31 = X509_get_serialNumber((X509 *)pCVar27);
              if (pAVar31->type == 0x102) {
                BIO_puts((BIO *)pCVar26,"-");
              }
              if (0 < pAVar31->length) {
                lVar66 = 0;
                do {
                  BIO_printf((BIO *)pCVar26,"%02x",(ulong)pAVar31->data[lVar66]);
                  lVar66 = lVar66 + 1;
                } while (lVar66 < pAVar31->length);
              }
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              iVar9 = (int)local_c70;
              Curl_ssl_push_certinfo_len
                        (pCVar59,(int)local_c70,"Serial Number",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              local_c08 = (ASN1_GENERALIZEDTIME *)0x0;
              pAVar32 = ASN1_STRING_new();
              if (pAVar32 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_bf8,&local_c08,local_c50);
                X509_signature_print((BIO *)pCVar26,(X509_ALGOR *)local_c08,pAVar32);
                ASN1_STRING_free(pAVar32);
                if (local_c08 != (ASN1_GENERALIZEDTIME *)0x0) {
                  i2a_ASN1_OBJECT((BIO *)pCVar26,*(ASN1_OBJECT **)local_c08);
                  sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
                  Curl_ssl_push_certinfo_len
                            (pCVar59,iVar9,"Public Key Algorithm",(char *)local_c78,sVar29);
                  BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
                }
              }
              uVar30 = X509_get0_extensions(local_c50);
              iVar9 = OPENSSL_sk_num(uVar30);
              if ((0 < iVar9) && (iVar9 = OPENSSL_sk_num(uVar30), 0 < iVar9)) {
                iVar9 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar30,iVar9);
                  pBVar23 = BIO_s_mem();
                  pBVar33 = BIO_new(pBVar23);
                  if (pBVar33 == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)local_bb8,0x80,a);
                  iVar13 = X509V3_EXT_print(pBVar33,ex,0,0);
                  if (iVar13 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(pBVar33,v);
                  }
                  BIO_ctrl(pBVar33,0x73,0,&local_c40);
                  pXVar53 = local_c40->cert_info;
                  if (pXVar53 != (X509_CINF *)0x0) {
                    buffer = local_a38;
                    pXVar68 = (X509_CINF *)0x0;
                    pXVar43 = local_c40;
                    do {
                      bVar70 = *(char *)((long)&pXVar43->sig_alg->algorithm + (long)pXVar68) == '\n'
                      ;
                      pcVar56 = "";
                      if (bVar70) {
                        pcVar56 = ", ";
                      }
                      pXVar68 = (X509_CINF *)((long)&pXVar68->version + (ulong)bVar70);
                      pXVar69 = pXVar68;
                      for (; pXVar68 < pXVar53; pXVar68 = (X509_CINF *)((long)&pXVar68->version + 1)
                          ) {
                        if (*(char *)((long)&pXVar43->sig_alg->algorithm + (long)pXVar68) != ' ') {
                          iVar13 = curl_msnprintf((char *)buffer,
                                                  (size_t)(&stack0xfffffffffffff7c8 + -(long)buffer)
                                                  ,"%s%c",pcVar56);
                          buffer = (BIGNUM **)((long)buffer + (long)iVar13);
                          pXVar53 = local_c40->cert_info;
                          pXVar43 = local_c40;
                          pXVar69 = pXVar68;
                          break;
                        }
                        pXVar69 = pXVar53;
                      }
                      pXVar68 = (X509_CINF *)((long)&pXVar69->version + 1);
                    } while (pXVar68 < pXVar53);
                  }
                  Curl_ssl_push_certinfo(pCVar59,(int)local_c70,(char *)local_bb8,(char *)local_a38)
                  ;
                  BIO_free(pBVar33);
                  iVar9 = iVar9 + 1;
                  iVar13 = OPENSSL_sk_num(uVar30);
                } while (iVar9 < iVar13);
              }
              pCVar27 = local_c50;
              pAVar34 = (ASN1_TIME *)X509_get0_notBefore(local_c50);
              pCVar26 = local_c48;
              ASN1_TIME_print((BIO *)local_c48,pAVar34);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              iVar9 = (int)local_c70;
              Curl_ssl_push_certinfo_len
                        (pCVar59,(int)local_c70,"Start date",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              pAVar34 = (ASN1_TIME *)X509_get0_notAfter(pCVar27);
              ASN1_TIME_print((BIO *)pCVar26,pAVar34);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              Curl_ssl_push_certinfo_len(pCVar59,iVar9,"Expire date",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              pEVar35 = X509_get_pubkey((X509 *)pCVar27);
              if (pEVar35 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar59,"   Unable to load public key\n");
              }
              else {
                iVar9 = EVP_PKEY_get_id(pEVar35);
                if (iVar9 == 0x74) {
                  uVar30 = EVP_PKEY_get0_DSA(pEVar35);
                  DSA_get0_pqg(uVar30,local_a38,local_bb8,&local_c40);
                  DSA_get0_key(uVar30,&local_c08,0);
                  iVar9 = (int)local_c70;
                  pubkey_show(pCVar59,(BIO *)pCVar26,(int)local_c70,"dsa","p",(BIGNUM *)local_a38[0]
                             );
                  pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,"dsa","q",(BIGNUM *)local_bb8[0]);
                  pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,"dsa","g",(BIGNUM *)local_c40);
                  pcVar56 = "dsa";
LAB_0043d32f:
                  pcVar18 = "pub_key";
                  pAVar39 = local_c08;
LAB_0043d336:
                  pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,pcVar56,pcVar18,(BIGNUM *)pAVar39);
                }
                else {
                  if (iVar9 == 0x1c) {
                    uVar30 = EVP_PKEY_get0_DH(pEVar35);
                    DH_get0_pqg(uVar30,local_a38,local_bb8,&local_c40);
                    DH_get0_key(uVar30,&local_c08,0);
                    iVar9 = (int)local_c70;
                    pubkey_show(pCVar59,(BIO *)pCVar26,(int)local_c70,"dh","p",
                                (BIGNUM *)local_a38[0]);
                    pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,"dh","q",(BIGNUM *)local_bb8[0]);
                    pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,"dh","g",(BIGNUM *)local_c40);
                    pcVar56 = "dh";
                    goto LAB_0043d32f;
                  }
                  if (iVar9 == 6) {
                    uVar30 = EVP_PKEY_get0_RSA(pEVar35);
                    RSA_get0_key(uVar30,local_a38,local_bb8,0);
                    BN_print(pCVar26,local_a38[0]);
                    sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
                    iVar9 = (int)local_c70;
                    Curl_ssl_push_certinfo_len
                              (pCVar59,(int)local_c70,"RSA Public Key",(char *)local_c78,sVar29);
                    BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
                    pubkey_show(pCVar59,(BIO *)pCVar26,iVar9,"rsa","n",(BIGNUM *)local_a38[0]);
                    pcVar56 = "rsa";
                    pcVar18 = "e";
                    pAVar39 = local_bb8[0];
                    goto LAB_0043d336;
                  }
                }
                EVP_PKEY_free(pEVar35);
              }
              iVar9 = (int)local_c30;
              if (local_bf8 != (int *)0x0) {
                if (0 < *local_bf8) {
                  lVar66 = 0;
                  do {
                    BIO_printf((BIO *)pCVar26,"%02x:",
                               (ulong)*(byte *)(*(long *)(local_bf8 + 2) + lVar66));
                    lVar66 = lVar66 + 1;
                  } while (lVar66 < *local_bf8);
                }
                sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
                Curl_ssl_push_certinfo_len
                          (pCVar59,(int)local_c70,"Signature",(char *)local_c78,sVar29);
                BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              }
              PEM_write_bio_X509((BIO *)pCVar26,(X509 *)local_c50);
              sVar29 = BIO_ctrl((BIO *)pCVar26,3,0,&local_c78);
              iVar13 = (int)local_c70;
              Curl_ssl_push_certinfo_len(pCVar59,(int)local_c70,"Cert",(char *)local_c78,sVar29);
              BIO_ctrl((BIO *)pCVar26,1,0,(void *)0x0);
              iVar13 = iVar13 + 1;
            } while (iVar13 != iVar9);
          }
          BIO_free((BIO *)pCVar26);
          pCVar26 = local_c68;
          psVar57 = local_c60;
          cVar65 = (char)local_c18;
        }
      }
    }
    pBVar23 = BIO_s_file();
    pBVar33 = BIO_new(pBVar23);
    if (pBVar33 == (BIO *)0x0) {
      uVar21 = ERR_get_error();
      ERR_error_string_n(uVar21,(char *)&local_b38,0x100);
      Curl_failf(pCVar26,"BIO_new return NULL, OpenSSL error %s",&local_b38);
      BIO_free(pBVar24);
      return CURLE_OUT_OF_MEMORY;
    }
    pXVar36 = (X509 *)SSL_get1_peer_certificate(psVar57->backend->handle);
    psVar57->backend->server_cert = pXVar36;
    if (pXVar36 == (X509 *)0x0) {
      BIO_free(pBVar33);
      BIO_free(pBVar24);
      if (cVar65 != '\0') {
        Curl_failf(pCVar26,"SSL: couldn\'t get peer certificate!");
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      local_c18 = (char *)CONCAT71(local_c18._1_7_,cVar65);
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar56 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar56 = "Server";
        }
      }
      else {
        pcVar56 = "Server";
      }
      local_c68 = pCVar26;
      Curl_infof(pCVar26,"%s certificate:\n",pcVar56);
      pXVar28 = X509_get_subject_name((X509 *)psVar57->backend->server_cert);
      iVar9 = x509_name_oneline((X509_NAME *)pXVar28,&stack0xfffffffffffff7c8,size);
      pcVar56 = "[NONE]";
      if (iVar9 == 0) {
        pcVar56 = &stack0xfffffffffffff7c8;
      }
      Curl_infof(pCVar26," subject: %s\n",pcVar56);
      pAVar34 = (ASN1_TIME *)X509_get0_notBefore(psVar57->backend->server_cert);
      ASN1_TIME_print(pBVar24,pAVar34);
      lVar66 = BIO_ctrl(pBVar24,3,0,&local_bc0);
      Curl_infof(pCVar26," start date: %.*s\n",lVar66);
      BIO_ctrl(pBVar24,1,0,(void *)0x0);
      pAVar34 = (ASN1_TIME *)X509_get0_notAfter(psVar57->backend->server_cert);
      ASN1_TIME_print(pBVar24,pAVar34);
      lVar66 = BIO_ctrl(pBVar24,3,0,&local_bc0);
      Curl_infof(pCVar26," expire date: %.*s\n",lVar66);
      BIO_ctrl(pBVar24,1,0,(void *)0x0);
      BIO_free(pBVar24);
      if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == true) {
          pXVar43 = (X509 *)psVar57->backend->server_cert;
          local_c48 = conn->data;
          lVar66 = 0x160;
          lVar22 = 0x158;
LAB_0043da2e:
          pcVar56 = *(char **)((conn->chunk).hexbuffer + lVar22 + -0x20);
          local_c20 = *(char **)((conn->chunk).hexbuffer + lVar66 + -0x20);
          local_c30 = pcVar56;
          if (((conn->bits).ipv6_ip == true) &&
             (iVar9 = inet_pton(10,pcVar56,local_a38), iVar9 != 0)) {
            iVar9 = 7;
            local_c10 = (stack_st_X509 *)0x10;
          }
          else {
            iVar9 = inet_pton(2,pcVar56,local_a38);
            local_c10 = (stack_st_X509 *)(ulong)((uint)(iVar9 != 0) * 4);
            iVar9 = (uint)(iVar9 != 0) * 5 + 2;
          }
          uVar30 = 0;
          a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar43,0x55,(int *)0x0,(int *)0x0);
          if (a_00 != (GENERAL_NAMES *)0x0) {
            iVar13 = OPENSSL_sk_num(a_00);
            if (0 < iVar13) {
              local_c70 = (OCSP_BASICRESP *)((ulong)local_c70 & 0xffffffff00000000);
              local_c50 = (Curl_easy *)((ulong)local_c50 & 0xffffffff00000000);
              uVar38 = 0;
              iVar64 = 0;
              local_bd8 = pXVar43;
LAB_0043daf9:
              local_bfc = (uint)uVar38;
              do {
                piVar37 = (int *)OPENSSL_sk_value(a_00,iVar64);
                iVar14 = *piVar37;
                uVar51 = (undefined7)((ulong)uVar30 >> 8);
                if (iVar14 == 2) {
                  uVar30 = CONCAT71(uVar51,1);
                  local_c70 = (OCSP_BASICRESP *)CONCAT44(local_c70._4_4_,(int)uVar30);
                }
                else if (iVar14 == 7) {
                  uVar30 = CONCAT71(uVar51,1);
                  local_c50 = (Curl_easy *)CONCAT44(local_c50._4_4_,(int)uVar30);
                }
                if (iVar14 == iVar9) {
                  pcVar56 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar37 + 2));
                  iVar14 = ASN1_STRING_length(*(ASN1_STRING **)(piVar37 + 2));
                  if (iVar9 == 7) {
                    if ((local_c10 == (stack_st_X509 *)(long)iVar14) &&
                       (iVar14 = bcmp(pcVar56,local_a38,(size_t)local_c10), iVar14 == 0))
                    goto LAB_0043dbaa;
                  }
                  else if (((iVar9 == 2) &&
                           (psVar25 = (stack_st_X509 *)strlen(pcVar56),
                           psVar25 == (stack_st_X509 *)(long)iVar14)) &&
                          (iVar14 = Curl_cert_hostcheck(pcVar56,local_c30), iVar14 != 0)) {
                    Curl_infof(local_c48," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                               local_c20,pcVar56);
                    goto LAB_0043f0d3;
                  }
                }
                psVar57 = local_c60;
                iVar64 = iVar64 + 1;
                if (iVar13 <= iVar64) {
                  GENERAL_NAMES_free(a_00);
                  pcVar56 = local_c20;
                  pCVar26 = local_c48;
                  if ((local_bfc & 1) != 0) goto LAB_0043e2dc;
                  pXVar43 = local_bd8;
                  if ((((byte)local_c70 | (byte)local_c50) & 1) == 0) goto LAB_0043ddb1;
                  Curl_infof(local_c48," subjectAltName does not match %s\n",local_c20);
                  Curl_failf(pCVar26,
                             "SSL: no alternative certificate subject name matches target host name \'%s\'"
                             ,pcVar56);
                  goto LAB_0043dda6;
                }
              } while( true );
            }
            GENERAL_NAMES_free(a_00);
          }
LAB_0043ddb1:
          local_bb8[0] = (ASN1_GENERALIZEDTIME *)0x4b446e;
          pXVar28 = X509_get_subject_name(pXVar43);
          if (pXVar28 == (X509_NAME *)0x0) {
LAB_0043e218:
            if (local_bb8[0] == (ASN1_GENERALIZEDTIME *)0x4b446e) {
              local_bb8[0] = (ASN1_GENERALIZEDTIME *)0x0;
              goto LAB_0043e272;
            }
            if (local_bb8[0] == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_0043e272;
            iVar9 = Curl_cert_hostcheck((char *)local_bb8[0],local_c30);
            if (iVar9 == 0) {
              Curl_failf(local_c48,
                         "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                         ,local_bb8[0],local_c20);
              goto LAB_0043e285;
            }
            CVar12 = CURLE_OK;
            Curl_infof(local_c48," common name: %s (matched)\n");
          }
          else {
            iVar9 = -1;
            do {
              iVar13 = iVar9;
              iVar9 = X509_NAME_get_index_by_NID(pXVar28,0xd,iVar13);
            } while (-1 < iVar9);
            if (iVar13 < 0) goto LAB_0043e218;
            ne = X509_NAME_get_entry(pXVar28,iVar13);
            pAVar32 = X509_NAME_ENTRY_get_data(ne);
            if (pAVar32 == (ASN1_STRING *)0x0) goto LAB_0043e218;
            iVar9 = ASN1_STRING_type(pAVar32);
            if (iVar9 == 0xc) {
              uVar10 = ASN1_STRING_length(pAVar32);
              if ((int)uVar10 < 0) {
                pAVar39 = (ASN1_GENERALIZEDTIME *)0x4b446e;
              }
              else {
                pAVar39 = (ASN1_GENERALIZEDTIME *)
                          CRYPTO_malloc(uVar10 + 1,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                        ,0x63e);
                local_bb8[0] = pAVar39;
                if (pAVar39 == (ASN1_GENERALIZEDTIME *)0x0) goto LAB_0043e272;
                __src = (void *)ASN1_STRING_get0_data(pAVar32);
                memcpy(pAVar39,__src,(ulong)uVar10);
                *(char *)((long)&pAVar39->length + (ulong)uVar10) = '\0';
              }
LAB_0043e1fc:
              uznum = strlen((char *)pAVar39);
              uVar15 = curlx_uztosi(uznum);
              if (uVar15 == uVar10) goto LAB_0043e218;
              Curl_failf(local_c48,"SSL: illegal cert name field");
              CVar12 = CURLE_PEER_FAILED_VERIFICATION;
              psVar57 = local_c60;
              if (local_bb8[0] == (ASN1_GENERALIZEDTIME *)0x4b446e) {
LAB_0043dda6:
                CVar12 = CURLE_PEER_FAILED_VERIFICATION;
                goto LAB_0043e2b6;
              }
              goto LAB_0043e29b;
            }
            uVar10 = ASN1_STRING_to_UTF8((uchar **)local_bb8,pAVar32);
            pAVar39 = local_bb8[0];
            if (local_bb8[0] != (ASN1_GENERALIZEDTIME *)0x0) goto LAB_0043e1fc;
LAB_0043e272:
            Curl_failf(local_c48,"SSL: unable to obtain common name from peer certificate");
LAB_0043e285:
            CVar12 = CURLE_PEER_FAILED_VERIFICATION;
          }
LAB_0043e29b:
          psVar57 = local_c60;
          if (local_bb8[0] != (ASN1_GENERALIZEDTIME *)0x0) {
            CRYPTO_free(local_bb8[0]);
          }
          if (CVar12 != CURLE_OK) {
LAB_0043e2b6:
            BIO_free(pBVar33);
            X509_free((X509 *)psVar57->backend->server_cert);
            psVar57->backend->server_cert = (X509 *)0x0;
            return CVar12;
          }
        }
      }
      else if ((conn->ssl_config).verifyhost != false) {
        pXVar43 = (X509 *)psVar57->backend->server_cert;
        local_c48 = conn->data;
        lVar66 = 0xd8;
        lVar22 = 0xd0;
        goto LAB_0043da2e;
      }
LAB_0043e2dc:
      pXVar28 = X509_get_issuer_name((X509 *)psVar57->backend->server_cert);
      iVar9 = x509_name_oneline((X509_NAME *)pXVar28,&stack0xfffffffffffff7c8,size_00);
      pCVar26 = local_c68;
      if (iVar9 == 0) {
        Curl_infof(local_c68," issuer: %s\n",&stack0xfffffffffffff7c8);
        cVar65 = (char)local_c18;
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          pcVar56 = (pCVar26->set).proxy_ssl.issuercert;
        }
        else {
          pcVar56 = (pCVar26->set).ssl.issuercert;
        }
        if (pcVar56 != (char *)0x0) {
          lVar66 = BIO_ctrl(pBVar33,0x6c,3,pcVar56);
          if ((int)lVar66 < 1) {
            if (cVar65 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar66 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar66 = 0xac0;
              }
              Curl_failf(pCVar26,"SSL: Unable to open issuer cert (%s)",
                         *(undefined8 *)((long)pCVar26->sockets + lVar66 + -0x80));
            }
            BIO_free(pBVar33);
            goto LAB_0043e511;
          }
          pXVar43 = PEM_read_bio_X509(pBVar33,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
          if (pXVar43 == (X509 *)0x0) {
            if (cVar65 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar66 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar66 = 0xac0;
              }
              Curl_failf(pCVar26,"SSL: Unable to read issuer cert (%s)",
                         *(undefined8 *)((long)pCVar26->sockets + lVar66 + -0x80));
            }
            BIO_free(pBVar33);
            pXVar43 = (X509 *)0x0;
          }
          else {
            iVar9 = X509_check_issued(pXVar43,(X509 *)psVar57->backend->server_cert);
            if (iVar9 == 0) {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar66 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar66 = 0xac0;
              }
              Curl_infof(pCVar26," SSL certificate issuer check ok (%s)\n",
                         *(undefined8 *)((long)pCVar26->sockets + lVar66 + -0x80));
              X509_free(pXVar43);
              goto LAB_0043e5bf;
            }
            if (cVar65 != '\0') {
              if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                 (lVar66 = 0xb70,
                 conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                lVar66 = 0xac0;
              }
              Curl_failf(pCVar26,"SSL: Certificate issuer check failed (%s)",
                         *(undefined8 *)((long)pCVar26->sockets + lVar66 + -0x80));
            }
            BIO_free(pBVar33);
          }
          X509_free(pXVar43);
LAB_0043e511:
          X509_free((X509 *)psVar57->backend->server_cert);
          psVar57->backend->server_cert = (X509 *)0x0;
          return CURLE_SSL_ISSUER_ERROR;
        }
LAB_0043e5bf:
        lVar66 = SSL_get_verify_result((SSL *)psVar57->backend->handle);
        *(long *)((long)pCVar26->sockets + (long)local_c38 + -0x80) = lVar66;
        if (lVar66 == 0) {
          CVar12 = CURLE_OK;
          Curl_infof(pCVar26," SSL certificate verify ok.\n");
        }
        else {
          if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_0043e65b:
              pcVar56 = X509_verify_cert_error_string(lVar66);
              CVar12 = CURLE_OK;
              Curl_infof(local_c68," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                         pcVar56,lVar66);
              goto LAB_0043e686;
            }
          }
          else if ((conn->ssl_config).verifypeer != true) goto LAB_0043e65b;
          CVar12 = CURLE_PEER_FAILED_VERIFICATION;
          if (cVar65 != '\0') {
            pcVar56 = X509_verify_cert_error_string(lVar66);
            Curl_failf(local_c68,"SSL certificate verify result: %s (%ld)",pcVar56,lVar66);
          }
        }
      }
      else {
        CVar12 = CURLE_PEER_FAILED_VERIFICATION;
        cVar65 = (char)local_c18;
        if ((char)local_c18 != '\0') {
          Curl_failf(local_c68,"SSL: couldn\'t get X509-issuer name!");
        }
      }
LAB_0043e686:
      cVar11 = (conn->http_proxy).proxytype;
      if ((cVar11 == CURLPROXY_HTTPS) &&
         (iVar9 = conn->sock[1], conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifystatus == false) {
          CVar16 = CURLE_OK;
          if (cVar65 != '\0') {
            CVar16 = CVar12;
          }
          goto LAB_0043e78d;
        }
LAB_0043e6f0:
        pCVar26 = conn->data;
        lVar66 = SSL_ctrl((SSL *)psVar57->backend->handle,0x46,0,local_a38);
        if (local_a38[0] == (BIGNUM *)0x0) {
          pcVar56 = "No OCSP response received";
LAB_0043e89d:
          resp = (OCSP_RESPONSE *)0x0;
          Curl_failf(pCVar26,pcVar56);
LAB_0043e8aa:
          OCSP_RESPONSE_free(resp);
          CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
        }
        else {
          resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)local_a38,lVar66);
          if (resp == (OCSP_RESPONSE *)0x0) {
            pcVar56 = "Invalid OCSP response";
            goto LAB_0043e89d;
          }
          uVar10 = OCSP_response_status(resp);
          if (uVar10 != 0) {
            pcVar56 = OCSP_response_status_str((long)(int)uVar10);
            Curl_failf(pCVar26,"Invalid OCSP response status: %s (%d)",pcVar56,(ulong)uVar10);
            psVar57 = local_c60;
            goto LAB_0043e8aa;
          }
          pOVar45 = OCSP_response_get1_basic(resp);
          psVar57 = local_c60;
          if (pOVar45 == (OCSP_BASICRESP *)0x0) {
            Curl_failf(pCVar26,"Invalid OCSP response");
            psVar57 = local_c60;
            goto LAB_0043e8aa;
          }
          local_c70 = (OCSP_BASICRESP *)SSL_get_peer_cert_chain((SSL *)local_c60->backend->handle);
          pXVar46 = SSL_CTX_get_cert_store((SSL_CTX *)psVar57->backend->ctx);
          iVar9 = OCSP_basic_verify(pOVar45,(stack_st_X509 *)local_c70,pXVar46,0);
          local_c70 = pOVar45;
          if (iVar9 < 1) {
            Curl_failf(pCVar26,"OCSP response verification failed");
LAB_0043f2a4:
            bVar70 = false;
            CVar16 = CURLE_SSL_INVALIDCERTSTATUS;
          }
          else {
            iVar9 = OCSP_resp_count(pOVar45);
            if (0 < iVar9) {
              iVar9 = 0;
              pOVar45 = local_c70;
              do {
                single = OCSP_resp_get0(pOVar45,iVar9);
                if (single != (OCSP_SINGLERESP *)0x0) {
                  uVar10 = OCSP_single_get0_status
                                     (single,(int *)&local_bf8,local_bb8,
                                      (ASN1_GENERALIZEDTIME **)&local_c40,&local_c78);
                  iVar13 = OCSP_check_validity((ASN1_GENERALIZEDTIME *)local_c40,local_c78,300,-1);
                  if (iVar13 == 0) {
                    Curl_failf(pCVar26,"OCSP response has expired");
                    psVar57 = local_c60;
                    goto LAB_0043f2a4;
                  }
                  pcVar56 = OCSP_cert_status_str((long)(int)uVar10);
                  Curl_infof(pCVar26,"SSL certificate status: %s (%d)\n",pcVar56,(ulong)uVar10);
                  psVar57 = local_c60;
                  if (uVar10 == 2) goto LAB_0043f2a4;
                  pOVar45 = local_c70;
                  if (uVar10 == 1) {
                    pcVar56 = OCSP_crl_reason_str((long)(int)local_bf8);
                    Curl_failf(pCVar26,"SSL certificate revocation reason: %s (%d)",pcVar56,
                               (ulong)local_bf8 & 0xffffffff);
                    psVar57 = local_c60;
                    goto LAB_0043f2a4;
                  }
                }
                iVar9 = iVar9 + 1;
                iVar13 = OCSP_resp_count(pOVar45);
                psVar57 = local_c60;
              } while (iVar9 < iVar13);
            }
            CVar16 = CURLE_OK;
            bVar70 = true;
          }
          OCSP_BASICRESP_free(local_c70);
          OCSP_RESPONSE_free(resp);
          if (bVar70) {
            cVar11 = (conn->http_proxy).proxytype;
            CVar12 = CURLE_OK;
            goto LAB_0043e6bb;
          }
        }
        BIO_free(pBVar33);
        X509_free((X509 *)psVar57->backend->server_cert);
        psVar57->backend->server_cert = (X509 *)0x0;
      }
      else {
        if ((conn->ssl_config).verifystatus == true) goto LAB_0043e6f0;
LAB_0043e6bb:
        CVar16 = CURLE_OK;
        if (cVar65 != '\0') {
          CVar16 = CVar12;
        }
        lVar66 = 0xd68;
        if (cVar11 == CURLPROXY_HTTPS) {
          iVar9 = conn->sock[1];
LAB_0043e78d:
          lVar66 = (ulong)(conn->proxy_ssl[iVar9 != -1].state != ssl_connection_complete) * 8 +
                   0xd68;
        }
        pCVar26 = local_c68;
        pcVar56 = *(char **)((long)local_c68->sockets + lVar66 + -0x80);
        local_bc0 = pcVar56;
        if ((CVar16 == CURLE_OK) && (pcVar56 != (char *)0x0)) {
          pXVar36 = psVar57->backend->server_cert;
          if (pXVar36 == (X509 *)0x0) {
LAB_0043ea21:
            CVar16 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar44 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar36);
            uVar10 = i2d_X509_PUBKEY(pXVar44,(uchar **)0x0);
            if ((int)uVar10 < 1) goto LAB_0043ea21;
            uVar21 = (ulong)uVar10;
            pubkey = (BIGNUM *)(*Curl_cmalloc)(uVar21);
            local_a38[0] = pubkey;
            if (pubkey == (BIGNUM *)0x0) goto LAB_0043ea21;
            pXVar44 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar36);
            uVar15 = i2d_X509_PUBKEY(pXVar44,(uchar **)local_a38);
            if (((long)local_a38[0] - (long)pubkey != uVar21 || uVar10 != uVar15) ||
                local_a38[0] == (BIGNUM *)0x0) {
              (*Curl_cfree)(pubkey);
              goto LAB_0043ea21;
            }
            CVar16 = Curl_pin_peer_pubkey(pCVar26,pcVar56,(uchar *)pubkey,uVar21);
            (*Curl_cfree)(pubkey);
            if (CVar16 == CURLE_OK) {
              CVar16 = CURLE_OK;
              psVar57 = local_c60;
              goto LAB_0043ea42;
            }
          }
          Curl_failf(pCVar26,"SSL: public key does not match pinned public key!");
          psVar57 = local_c60;
        }
LAB_0043ea42:
        BIO_free(pBVar33);
        X509_free((X509 *)psVar57->backend->server_cert);
        psVar57->backend->server_cert = (X509 *)0x0;
        psVar57->connecting_state = ssl_connect_done;
      }
      if (CVar16 != CURLE_OK) {
        return CVar16;
      }
    }
  }
  else if (sVar8 != ssl_connect_done) {
    _Var7 = false;
    goto LAB_0043c6c0;
  }
  psVar57->state = ssl_connection_complete;
  conn->recv[local_bd0] = ossl_recv;
  conn->send[local_bd0] = ossl_send;
  _Var7 = true;
LAB_0043c6c0:
  *local_be8 = _Var7;
  psVar57->connecting_state = ssl_connect_1;
  return CURLE_OK;
LAB_0043dbaa:
  Curl_infof(local_c48," subjectAltName: host \"%s\" matched cert\'s IP address!\n",local_c20);
  iVar64 = iVar64 + 1;
  uVar38 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  if (iVar13 <= iVar64) goto LAB_0043f0d3;
  goto LAB_0043daf9;
LAB_0043f0d3:
  psVar57 = local_c60;
  GENERAL_NAMES_free(a_00);
  goto LAB_0043e2dc;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading ==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}